

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_statement.cpp
# Opt level: O2

string * __thiscall
duckdb::SetVariableStatement::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SetVariableStatement *this)

{
  pointer pPVar1;
  SetScope scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"SET %s %s TO %s;",&local_91);
  ScopeToString_abi_cxx11_(&local_50,(duckdb *)(ulong)(this->super_SetStatement).scope,scope);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&(this->super_SetStatement).name);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->value);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_90,pPVar1);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_30,&local_50,&local_70,&local_90,in_R9);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

string SetVariableStatement::ToString() const {
	return StringUtil::Format("SET %s %s TO %s;", ScopeToString(scope), name, value->ToString());
}